

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O3

ostream * setup::operator<<(ostream *os,data *version)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  uStack_18 = CONCAT17(0x2e,(undefined7)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 7),1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if (version->build != 0) {
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const windows_version::data & version) {
	os << version.major << '.' << version.minor;
	if(version.build) {
		os << version.build;
	}
	return os;
}